

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglInfoTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::QueryStringCase::iterate(QueryStringCase *this)

{
  int iVar1;
  deUint32 err;
  Library *pLVar2;
  undefined4 extraout_var;
  size_t sVar3;
  allocator<char> local_199;
  undefined1 local_198 [8];
  _func_int **local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_120 [264];
  char *__s;
  
  pLVar2 = EglTestContext::getLibrary((this->super_InfoCase).super_TestCase.m_eglTestCtx);
  iVar1 = (*pLVar2->_vptr_Library[0x2a])
                    (pLVar2,(this->super_InfoCase).m_display,(ulong)(uint)this->m_query);
  __s = (char *)CONCAT44(extraout_var,iVar1);
  err = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
  eglu::checkError(err,"eglQueryString() failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglInfoTests.cpp"
                   ,0x7f);
  local_198 = (undefined1  [8])
              ((this->super_InfoCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_190 + (int)local_190[-3]);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,__s,sVar3);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::ios_base::~ios_base(local_120);
  tcu::TestContext::setTestResult
            ((this->super_InfoCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  std::__cxx11::string::string<std::allocator<char>>((string *)local_198,__s,&local_199);
  validateString(this,(string *)local_198);
  if (local_198 != (undefined1  [8])local_188) {
    operator_delete((void *)local_198,local_188[0]._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		const char*		result	= egl.queryString(m_display, m_query);
		EGLU_CHECK_MSG(egl, "eglQueryString() failed");

		m_testCtx.getLog() << tcu::TestLog::Message << result << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		validateString(result);

		return STOP;
	}